

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O0

void __thiscall
t_html_generator::generate_program_toc_rows
          (t_html_generator *this,t_program *tprog,
          vector<t_program_*,_std::allocator<t_program_*>_> *finished)

{
  bool bVar1;
  __type _Var2;
  string *__lhs;
  string *__rhs;
  vector<t_program_*,_std::allocator<t_program_*>_> *__x;
  reference pptVar3;
  t_program **include;
  iterator __end1_1;
  iterator __begin1_1;
  vector<t_program_*,_std::allocator<t_program_*>_> *__range1_1;
  vector<t_program_*,_std::allocator<t_program_*>_> includes;
  t_program **iter;
  iterator __end1;
  iterator __begin1;
  vector<t_program_*,_std::allocator<t_program_*>_> *__range1;
  vector<t_program_*,_std::allocator<t_program_*>_> *finished_local;
  t_program *tprog_local;
  t_html_generator *this_local;
  
  finished_local = (vector<t_program_*,_std::allocator<t_program_*>_> *)tprog;
  tprog_local = (t_program *)this;
  __end1 = std::vector<t_program_*,_std::allocator<t_program_*>_>::begin(finished);
  iter = (t_program **)std::vector<t_program_*,_std::allocator<t_program_*>_>::end(finished);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<t_program_**,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                                *)&iter);
    if (!bVar1) {
      std::vector<t_program_*,_std::allocator<t_program_*>_>::push_back
                (finished,(value_type *)&finished_local);
      generate_program_toc_row(this,(t_program *)finished_local);
      __x = t_program::get_includes((t_program *)finished_local);
      std::vector<t_program_*,_std::allocator<t_program_*>_>::vector
                ((vector<t_program_*,_std::allocator<t_program_*>_> *)&__range1_1,__x);
      __end1_1 = std::vector<t_program_*,_std::allocator<t_program_*>_>::begin
                           ((vector<t_program_*,_std::allocator<t_program_*>_> *)&__range1_1);
      include = (t_program **)
                std::vector<t_program_*,_std::allocator<t_program_*>_>::end
                          ((vector<t_program_*,_std::allocator<t_program_*>_> *)&__range1_1);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<t_program_**,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                                 *)&include), bVar1) {
        pptVar3 = __gnu_cxx::
                  __normal_iterator<t_program_**,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                  ::operator*(&__end1_1);
        generate_program_toc_rows(this,*pptVar3,finished);
        __gnu_cxx::
        __normal_iterator<t_program_**,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>::
        operator++(&__end1_1);
      }
      std::vector<t_program_*,_std::allocator<t_program_*>_>::~vector
                ((vector<t_program_*,_std::allocator<t_program_*>_> *)&__range1_1);
      return;
    }
    includes.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         __gnu_cxx::
         __normal_iterator<t_program_**,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>::
         operator*(&__end1);
    __lhs = t_program::get_path_abi_cxx11_((t_program *)finished_local);
    __rhs = t_program::get_path_abi_cxx11_
                      (*includes.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    _Var2 = std::operator==(__lhs,__rhs);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<t_program_**,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void t_html_generator::generate_program_toc_rows(t_program* tprog,
                                                 std::vector<t_program*>& finished) {
  for (auto & iter : finished) {
    if (tprog->get_path() == iter->get_path()) {
      return;
    }
  }
  finished.push_back(tprog);
  generate_program_toc_row(tprog);
  vector<t_program*> includes = tprog->get_includes();
  for (auto & include : includes) {
    generate_program_toc_rows(include, finished);
  }
}